

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O1

matrix<int,_2UL> *
trng::operator*(matrix<int,_2UL> *__return_storage_ptr__,matrix<int,_2UL> *a,matrix<int,_2UL> *b)

{
  pointer piVar1;
  value_type_conflict *__val;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  pointer piVar5;
  long lVar6;
  size_type k;
  long lVar7;
  int sum;
  int iVar8;
  bool bVar9;
  
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar2 = (pointer)operator_new(0x10);
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = piVar2;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar2;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar2 + 4;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar2 + 4;
  piVar3 = (a->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (b->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  lVar4 = 0;
  do {
    piVar5 = piVar1;
    lVar6 = 0;
    do {
      lVar7 = 0;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + piVar5[lVar7 * 2] * piVar3[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 == 1);
      piVar2[lVar4 * 2 + lVar6] = piVar2[lVar4 * 2 + lVar6] + iVar8;
      piVar5 = piVar5 + 1;
      bVar9 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar9);
    piVar3 = piVar3 + 2;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }